

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>
fmt::v8::detail::
write_int_noinline<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned_int>
          (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> out,
          write_int_arg<unsigned_int> arg,basic_format_specs<char16_t> *specs,locale_ref loc)

{
  uint uVar1;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> bVar2;
  write_int_arg<unsigned_int> wVar3;
  int iVar4;
  type tVar5;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> *pbVar6;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> bVar7;
  bool bVar8;
  char local_36b;
  char local_369;
  basic_format_specs<char16_t> *specs_local;
  locale_ref loc_local;
  write_int_arg<unsigned_int> arg_local;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> out_local;
  int num_digits_3;
  int num_digits_2;
  bool upper_1;
  int num_digits_1;
  bool upper;
  int num_digits;
  uint local_298;
  uint32_t local_294;
  uint prefix;
  uint abs_value;
  void *local_288;
  write_int_arg<unsigned_int> local_280;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> local_278;
  buffer<char16_t> *local_270;
  anon_class_32_3_03e05ccd local_268;
  buffer<char16_t> *local_248;
  undefined1 local_240 [8];
  write_int_data<char16_t> data;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> local_218;
  value_type_conflict3 local_20e;
  uint local_20c;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> bStack_208;
  uint p;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> it;
  anon_class_8_2_0dfc6556_for_write_digits local_1f0;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> local_1e8;
  buffer<char16_t> *local_1e0;
  anon_class_40_3_03e05ccd local_1d8;
  buffer<char16_t> *local_1b0;
  undefined1 local_1a8 [8];
  write_int_data<char16_t> data_1;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> local_180;
  value_type_conflict3 local_176;
  uint local_174;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> bStack_170;
  uint p_1;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> it_1;
  bool local_14c;
  undefined3 uStack_14b;
  anon_class_12_3_01816715_for_write_digits local_144;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> local_138;
  buffer<char16_t> *local_130;
  anon_class_32_3_03e05ccd local_128;
  buffer<char16_t> *local_108;
  undefined1 local_100 [8];
  write_int_data<char16_t> data_2;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> local_d8;
  value_type_conflict3 local_ce;
  uint local_cc;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> bStack_c8;
  uint p_2;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> it_2;
  anon_class_8_2_0dfc6556_for_write_digits local_b0;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> local_a8;
  buffer<char16_t> *local_a0;
  anon_class_32_3_03e05ccd local_98;
  buffer<char16_t> *local_78;
  undefined1 local_70 [8];
  write_int_data<char16_t> data_3;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> local_48;
  value_type_conflict3 local_3e;
  uint local_3c;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> bStack_38;
  uint p_3;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> it_3;
  anon_class_8_2_0dfc6556_for_write_digits local_20;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> local_18;
  buffer<char16_t> *local_10;
  
  local_280.abs_value = arg.abs_value;
  local_294 = local_280.abs_value;
  local_280.prefix = arg.prefix;
  local_298 = local_280.prefix;
  _prefix = (buffer<char16_t> *)specs;
  local_288 = loc.locale_;
  local_280 = arg;
  local_278.container = out.container;
  switch(specs->type) {
  case none:
  case dec:
    wVar3 = arg;
    if (((*(ushort *)&specs->field_0x9 >> 8 & 1) == 0) ||
       (uVar1 = local_280.prefix,
       bVar8 = write_int_localized<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned_long,char16_t>
                         (&local_278,(ulong)arg & 0xffffffff,uVar1,specs,loc), wVar3 = local_280,
       !bVar8)) {
      local_280 = wVar3;
      iVar4 = count_digits(local_294);
      uVar1 = local_298;
      local_1f0.num_digits = iVar4;
      local_1f0.abs_value = local_294;
      local_1e8.container = local_278.container;
      it.container = _prefix;
      if (*(int *)&_prefix->_vptr_buffer == 0 && *(int *)((long)&_prefix->_vptr_buffer + 4) == -1) {
        tVar5 = to_unsigned<int>(iVar4);
        pbVar6 = reserve<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
                           (&local_1e8,(ulong)(tVar5 + (uVar1 >> 0x18)));
        bStack_208.container = pbVar6->container;
        if (uVar1 != 0) {
          for (local_20c = uVar1 & 0xffffff; local_20c != 0; local_20c = local_20c >> 8) {
            local_20e = (ushort)local_20c & 0xff;
            local_218 = std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>::operator++
                                  (&stack0xfffffffffffffdf8,0);
            pbVar6 = std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>::operator*
                               (&local_218);
            std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>::operator=
                      (pbVar6,&local_20e);
          }
        }
        bVar2.container = local_1e8.container;
        data.padding = (size_t)bStack_208.container;
        bVar7 = write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>,_char16_t,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format.h:1589:41)>
                ::anon_class_32_3_03e05ccd::anon_class_8_2_0dfc6556_for_write_digits::operator()
                          (&local_1f0,bStack_208.container);
        local_1e0 = (buffer<char16_t> *)
                    base_iterator<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
                              (bVar2,bVar7);
      }
      else {
        write_int_data<char16_t>::write_int_data
                  ((write_int_data<char16_t> *)local_240,iVar4,local_298,
                   (basic_format_specs<char16_t> *)_prefix);
        local_248 = local_1e8.container;
        local_268.prefix = uVar1;
        local_268.data.size = (size_t)local_240;
        local_268.data.padding = data.size;
        local_268.write_digits = local_1f0;
        local_1e0 = (buffer<char16_t> *)
                    write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::write_int<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned_int>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_1_>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,int,unsigned_int,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::write_int<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned_int>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_1_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_1_>
                              (local_1e8,it.container,(size_t)local_240,&local_268);
      }
      local_270 = local_1e0;
    }
    else {
      local_270 = local_278.container;
    }
    break;
  case oct:
    uVar1 = local_280.abs_value;
    iVar4 = count_digits<3,unsigned_int>(uVar1);
    if ((((*(ushort *)((long)&_prefix->ptr_ + 1) >> 7 & 1) != 0) &&
        (*(int *)((long)&_prefix->_vptr_buffer + 4) <= iVar4)) && (local_294 != 0)) {
      prefix_append(&local_298,0x30);
    }
    uVar1 = local_298;
    local_20.num_digits = iVar4;
    local_20.abs_value = local_294;
    local_18.container = local_278.container;
    it_3.container = _prefix;
    if (*(int *)&_prefix->_vptr_buffer == 0 && *(int *)((long)&_prefix->_vptr_buffer + 4) == -1) {
      tVar5 = to_unsigned<int>(iVar4);
      pbVar6 = reserve<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
                         (&local_18,(ulong)(tVar5 + (uVar1 >> 0x18)));
      bStack_38.container = pbVar6->container;
      if (uVar1 != 0) {
        for (local_3c = uVar1 & 0xffffff; local_3c != 0; local_3c = local_3c >> 8) {
          local_3e = (ushort)local_3c & 0xff;
          local_48 = std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>::operator++
                               (&stack0xffffffffffffffc8,0);
          pbVar6 = std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>::operator*
                             (&local_48);
          std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>::operator=(pbVar6,&local_3e)
          ;
        }
      }
      bVar2.container = local_18.container;
      data_3.padding = (size_t)bStack_38.container;
      bVar7 = write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>,_char16_t,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format.h:1622:22)>
              ::anon_class_32_3_03e05ccd::anon_class_8_2_0dfc6556_for_write_digits::operator()
                        (&local_20,bStack_38.container);
      local_10 = (buffer<char16_t> *)
                 base_iterator<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
                           (bVar2,bVar7);
    }
    else {
      write_int_data<char16_t>::write_int_data
                ((write_int_data<char16_t> *)local_70,iVar4,local_298,
                 (basic_format_specs<char16_t> *)_prefix);
      local_78 = local_18.container;
      local_98.prefix = uVar1;
      local_98.data.size = (size_t)local_70;
      local_98.data.padding = data_3.size;
      local_98.write_digits = local_20;
      local_10 = (buffer<char16_t> *)
                 write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::write_int<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned_int>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_4_>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,int,unsigned_int,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::write_int<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned_int>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_4_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_1_>
                           (local_18,it_3.container,(size_t)local_70,&local_98);
    }
    local_270 = local_10;
    break;
  case hex_lower:
  case hex_upper:
    bVar8 = specs->type == hex_upper;
    if ((*(ushort *)&specs->field_0x9 >> 7 & 1) != 0) {
      local_369 = 'X';
      if (!bVar8) {
        local_369 = 'x';
      }
      prefix_append(&local_298,(int)local_369 << 8 | 0x30);
    }
    iVar4 = count_digits<4,unsigned_int>(local_294);
    uVar1 = local_298;
    local_144.num_digits = iVar4;
    local_144.abs_value = local_294;
    local_138.container = local_278.container;
    local_144.upper = bVar8;
    local_144._9_3_ = uStack_14b;
    it_1.container = _prefix;
    if (*(int *)&_prefix->_vptr_buffer == 0 && *(int *)((long)&_prefix->_vptr_buffer + 4) == -1) {
      tVar5 = to_unsigned<int>(iVar4);
      pbVar6 = reserve<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
                         (&local_138,(ulong)(tVar5 + (uVar1 >> 0x18)));
      bStack_170.container = pbVar6->container;
      if (uVar1 != 0) {
        for (local_174 = uVar1 & 0xffffff; local_174 != 0; local_174 = local_174 >> 8) {
          local_176 = (ushort)local_174 & 0xff;
          local_180 = std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>::operator++
                                (&stack0xfffffffffffffe90,0);
          pbVar6 = std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>::operator*
                             (&local_180);
          std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>::operator=
                    (pbVar6,&local_176);
        }
      }
      bVar2.container = local_138.container;
      data_1.padding = (size_t)bStack_170.container;
      bVar7 = write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>,_char16_t,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format.h:1600:41)>
              ::anon_class_40_3_03e05ccd::anon_class_12_3_01816715_for_write_digits::operator()
                        (&local_144,bStack_170.container);
      local_130 = (buffer<char16_t> *)
                  base_iterator<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
                            (bVar2,bVar7);
    }
    else {
      write_int_data<char16_t>::write_int_data
                ((write_int_data<char16_t> *)local_1a8,iVar4,local_298,
                 (basic_format_specs<char16_t> *)_prefix);
      local_1b0 = local_138.container;
      local_1d8.prefix = uVar1;
      local_1d8.data.size = (size_t)local_1a8;
      local_1d8.data.padding = data_1.size;
      local_1d8.write_digits.abs_value = local_144.abs_value;
      local_1d8.write_digits.num_digits = local_144.num_digits;
      local_1d8.write_digits.upper = local_144.upper;
      local_130 = (buffer<char16_t> *)
                  write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::write_int<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned_int>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_2_>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,int,unsigned_int,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::write_int<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned_int>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_2_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_1_>
                            (local_138,it_1.container,(size_t)local_1a8,&local_1d8);
    }
    local_270 = local_130;
    break;
  case bin_lower:
  case bin_upper:
    if ((*(ushort *)&specs->field_0x9 >> 7 & 1) != 0) {
      local_36b = 'B';
      if (specs->type != bin_upper) {
        local_36b = 'b';
      }
      prefix_append(&local_298,(int)local_36b << 8 | 0x30);
    }
    iVar4 = count_digits<1,unsigned_int>(local_294);
    uVar1 = local_298;
    local_b0.num_digits = iVar4;
    local_b0.abs_value = local_294;
    local_a8.container = local_278.container;
    it_2.container = _prefix;
    if (*(int *)&_prefix->_vptr_buffer == 0 && *(int *)((long)&_prefix->_vptr_buffer + 4) == -1) {
      tVar5 = to_unsigned<int>(iVar4);
      pbVar6 = reserve<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
                         (&local_a8,(ulong)(tVar5 + (uVar1 >> 0x18)));
      bStack_c8.container = pbVar6->container;
      if (uVar1 != 0) {
        for (local_cc = uVar1 & 0xffffff; local_cc != 0; local_cc = local_cc >> 8) {
          local_ce = (ushort)local_cc & 0xff;
          local_d8 = std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>::operator++
                               (&stack0xffffffffffffff38,0);
          pbVar6 = std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>::operator*
                             (&local_d8);
          std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>::operator=(pbVar6,&local_ce)
          ;
        }
      }
      bVar2.container = local_a8.container;
      data_2.padding = (size_t)bStack_c8.container;
      bVar7 = write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>,_char16_t,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format.h:1611:22)>
              ::anon_class_32_3_03e05ccd::anon_class_8_2_0dfc6556_for_write_digits::operator()
                        (&local_b0,bStack_c8.container);
      local_a0 = (buffer<char16_t> *)
                 base_iterator<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
                           (bVar2,bVar7);
    }
    else {
      write_int_data<char16_t>::write_int_data
                ((write_int_data<char16_t> *)local_100,iVar4,local_298,
                 (basic_format_specs<char16_t> *)_prefix);
      local_108 = local_a8.container;
      local_128.prefix = uVar1;
      local_128.data.size = (size_t)local_100;
      local_128.data.padding = data_2.size;
      local_128.write_digits = local_b0;
      local_a0 = (buffer<char16_t> *)
                 write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::write_int<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned_int>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_3_>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,int,unsigned_int,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::write_int<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,unsigned_int>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_3_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_1_>
                           (local_a8,it_2.container,(size_t)local_100,&local_128);
    }
    local_270 = local_a0;
    break;
  default:
    fmt::v8::detail::throw_format_error("invalid type specifier");
    break;
  case chr:
    local_270 = (buffer<char16_t> *)
                write_char<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
                          (out,(char16_t)arg.abs_value,specs);
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)local_270;
}

Assistant:

FMT_CONSTEXPR FMT_NOINLINE auto write_int_noinline(
    OutputIt out, write_int_arg<T> arg, const basic_format_specs<Char>& specs,
    locale_ref loc) -> OutputIt {
  return write_int(out, arg, specs, loc);
}